

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_hpf_uninit(ma_hpf *pHPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_hpf1 *pmVar1;
  ma_hpf2 *pmVar2;
  ulong uVar3;
  long lVar4;
  
  if (pHPF != (ma_hpf *)0x0) {
    if (pHPF->hpf1Count != 0) {
      lVar4 = 0x20;
      uVar3 = 0;
      do {
        pmVar1 = pHPF->pHPF1;
        if ((pmVar1 != (ma_hpf1 *)0x0) && (*(int *)((long)&pmVar1->format + lVar4) != 0)) {
          ma_free(*(void **)((long)pmVar1 + lVar4 + -8),pAllocationCallbacks);
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x28;
      } while (uVar3 < pHPF->hpf1Count);
    }
    if (pHPF->hpf2Count != 0) {
      lVar4 = 0x38;
      uVar3 = 0;
      do {
        pmVar2 = pHPF->pHPF2;
        if ((pmVar2 != (ma_hpf2 *)0x0) && (*(int *)((long)&(pmVar2->bq).format + lVar4) != 0)) {
          ma_free(*(void **)((long)pmVar2 + lVar4 + -8),pAllocationCallbacks);
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x40;
      } while (uVar3 < pHPF->hpf2Count);
    }
    if (pHPF->_ownsHeap != 0) {
      ma_free(pHPF->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_hpf_uninit(ma_hpf* pHPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ihpf1;
    ma_uint32 ihpf2;

    if (pHPF == NULL) {
        return;
    }

    for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
        ma_hpf1_uninit(&pHPF->pHPF1[ihpf1], pAllocationCallbacks);
    }

    for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
        ma_hpf2_uninit(&pHPF->pHPF2[ihpf2], pAllocationCallbacks);
    }

    if (pHPF->_ownsHeap) {
        ma_free(pHPF->_pHeap, pAllocationCallbacks);
    }
}